

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int ProcessStandardArguments(ImportData *fill,char **params,uint num)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  allocator<char> local_51;
  string local_50 [36];
  uint local_2c;
  char *pcStack_28;
  uint ofs;
  char *param;
  uint i;
  uint num_local;
  char **params_local;
  ImportData *fill_local;
  
  param._4_4_ = num;
  _i = params;
  params_local = (char **)fill;
  for (param._0_4_ = 0; (uint)param < param._4_4_; param._0_4_ = (uint)param + 1) {
    pcStack_28 = _i[(uint)param];
    printf("param = %s\n",pcStack_28);
    iVar2 = strcmp(pcStack_28,"-ptv");
    if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_28,"--pretransform-vertices"), iVar2 == 0)) {
      *(uint *)params_local = *(uint *)params_local | 0x100;
    }
    else {
      iVar2 = strcmp(pcStack_28,"-gsn");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_28,"--gen-smooth-normals"), iVar2 == 0)) {
        *(uint *)params_local = *(uint *)params_local | 0x40;
      }
      else {
        iVar2 = strcmp(pcStack_28,"-dn");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_28,"--drop-normals"), iVar2 == 0)) {
          *(uint *)params_local = *(uint *)params_local | 0x40000000;
        }
        else {
          iVar2 = strcmp(pcStack_28,"-gn");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_28,"--gen-normals"), iVar2 == 0)) {
            *(uint *)params_local = *(uint *)params_local | 0x20;
          }
          else {
            iVar2 = strcmp(pcStack_28,"-jiv");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_28,"--join-identical-vertices"), iVar2 == 0)
               ) {
              *(uint *)params_local = *(uint *)params_local | 2;
            }
            else {
              iVar2 = strcmp(pcStack_28,"-rrm");
              if ((iVar2 == 0) ||
                 (iVar2 = strcmp(pcStack_28,"--remove-redundant-materials"), iVar2 == 0)) {
                *(uint *)params_local = *(uint *)params_local | 0x1000;
              }
              else {
                iVar2 = strcmp(pcStack_28,"-fd");
                if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_28,"--find-degenerates"), iVar2 == 0)) {
                  *(uint *)params_local = *(uint *)params_local | 0x10000;
                }
                else {
                  iVar2 = strcmp(pcStack_28,"-slm");
                  if ((iVar2 == 0) ||
                     (iVar2 = strcmp(pcStack_28,"--split-large-meshes"), iVar2 == 0)) {
                    *(uint *)params_local = *(uint *)params_local | 0x80;
                  }
                  else {
                    iVar2 = strcmp(pcStack_28,"-lbw");
                    if ((iVar2 == 0) ||
                       (iVar2 = strcmp(pcStack_28,"--limit-bone-weights"), iVar2 == 0)) {
                      *(uint *)params_local = *(uint *)params_local | 0x200;
                    }
                    else {
                      iVar2 = strcmp(pcStack_28,"-vds");
                      if ((iVar2 == 0) ||
                         (iVar2 = strcmp(pcStack_28,"--validate-data-structure"), iVar2 == 0)) {
                        *(uint *)params_local = *(uint *)params_local | 0x400;
                      }
                      else {
                        iVar2 = strcmp(pcStack_28,"-icl");
                        if ((iVar2 == 0) ||
                           (iVar2 = strcmp(pcStack_28,"--improve-cache-locality"), iVar2 == 0)) {
                          *(uint *)params_local = *(uint *)params_local | 0x800;
                        }
                        else {
                          iVar2 = strcmp(pcStack_28,"-sbpt");
                          if ((iVar2 == 0) ||
                             (iVar2 = strcmp(pcStack_28,"--sort-by-ptype"), iVar2 == 0)) {
                            *(uint *)params_local = *(uint *)params_local | 0x8000;
                          }
                          else {
                            iVar2 = strcmp(pcStack_28,"-lh");
                            if ((iVar2 == 0) ||
                               (iVar2 = strcmp(pcStack_28,"--left-handed"), iVar2 == 0)) {
                              *(uint *)params_local = *(uint *)params_local | 0x1800004;
                            }
                            else {
                              iVar2 = strcmp(pcStack_28,"-fuv");
                              if ((iVar2 == 0) ||
                                 (iVar2 = strcmp(pcStack_28,"--flip-uv"), iVar2 == 0)) {
                                *(uint *)params_local = *(uint *)params_local | 0x800000;
                              }
                              else {
                                iVar2 = strcmp(pcStack_28,"-fwo");
                                if ((iVar2 == 0) ||
                                   (iVar2 = strcmp(pcStack_28,"--flip-winding-order"), iVar2 == 0))
                                {
                                  *(uint *)params_local = *(uint *)params_local | 0x1000000;
                                }
                                else {
                                  iVar2 = strcmp(pcStack_28,"-tuv");
                                  if ((iVar2 == 0) ||
                                     (iVar2 = strcmp(pcStack_28,"--transform-uv-coords"), iVar2 == 0
                                     )) {
                                    *(uint *)params_local = *(uint *)params_local | 0x80000;
                                  }
                                  else {
                                    iVar2 = strcmp(pcStack_28,"-guv");
                                    if ((iVar2 == 0) ||
                                       (iVar2 = strcmp(pcStack_28,"--gen-uvcoords"), iVar2 == 0)) {
                                      *(uint *)params_local = *(uint *)params_local | 0x40000;
                                    }
                                    else {
                                      iVar2 = strcmp(pcStack_28,"-fid");
                                      if ((iVar2 == 0) ||
                                         (iVar2 = strcmp(pcStack_28,"--find-invalid-data"),
                                         iVar2 == 0)) {
                                        *(uint *)params_local = *(uint *)params_local | 0x20000;
                                      }
                                      else {
                                        iVar2 = strcmp(pcStack_28,"-fixn");
                                        if ((iVar2 == 0) ||
                                           (iVar2 = strcmp(pcStack_28,"--fix-normals"), iVar2 == 0))
                                        {
                                          *(uint *)params_local = *(uint *)params_local | 0x2000;
                                        }
                                        else {
                                          iVar2 = strcmp(pcStack_28,"-tri");
                                          if ((iVar2 == 0) ||
                                             (iVar2 = strcmp(pcStack_28,"--triangulate"), iVar2 == 0
                                             )) {
                                            *(uint *)params_local = *(uint *)params_local | 8;
                                          }
                                          else {
                                            iVar2 = strcmp(pcStack_28,"-cts");
                                            if ((iVar2 == 0) ||
                                               (iVar2 = strcmp(pcStack_28,"--calc-tangent-space"),
                                               iVar2 == 0)) {
                                              *(uint *)params_local = *(uint *)params_local | 1;
                                            }
                                            else {
                                              iVar2 = strcmp(pcStack_28,"-fi");
                                              if ((iVar2 == 0) ||
                                                 (iVar2 = strcmp(pcStack_28,"--find-instances"),
                                                 iVar2 == 0)) {
                                                *(uint *)params_local =
                                                     *(uint *)params_local | 0x100000;
                                              }
                                              else {
                                                iVar2 = strcmp(pcStack_28,"-og");
                                                if ((iVar2 == 0) ||
                                                   (iVar2 = strcmp(pcStack_28,"--optimize-graph"),
                                                   iVar2 == 0)) {
                                                  *(uint *)params_local =
                                                       *(uint *)params_local | 0x400000;
                                                }
                                                else {
                                                  iVar2 = strcmp(pcStack_28,"-om");
                                                  if ((iVar2 == 0) ||
                                                     (iVar2 = strcmp(pcStack_28,"--optimize-meshes")
                                                     , iVar2 == 0)) {
                                                    *(uint *)params_local =
                                                         *(uint *)params_local | 0x200000;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(pcStack_28,"-db");
                                                    if ((iVar2 == 0) ||
                                                       (iVar2 = strcmp(pcStack_28,"--debone"),
                                                       iVar2 == 0)) {
                                                      *(uint *)params_local =
                                                           *(uint *)params_local | 0x4000000;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(pcStack_28,"-sbc");
                                                      if ((iVar2 == 0) ||
                                                         (iVar2 = strcmp(pcStack_28,
                                                                         "--split-by-bone-count"),
                                                         iVar2 == 0)) {
                                                        *(uint *)params_local =
                                                             *(uint *)params_local | 0x2000000;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(pcStack_28,"-embtex");
                                                        if ((iVar2 == 0) ||
                                                           (iVar2 = strcmp(pcStack_28,
                                                                           "--embed-textures"),
                                                           iVar2 == 0)) {
                                                          *(uint *)params_local =
                                                               *(uint *)params_local | 0x10000000;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(pcStack_28,"-gs");
                                                          if ((iVar2 == 0) ||
                                                             (iVar2 = strcmp(pcStack_28,
                                                                             "--global-scale"),
                                                             iVar2 == 0)) {
                                                            *(uint *)params_local =
                                                                 *(uint *)params_local | 0x8000000;
                                                          }
                                                          else {
                                                            iVar2 = strncmp(pcStack_28,"-c",2);
                                                            if ((iVar2 == 0) ||
                                                               (iVar2 = strncmp(pcStack_28,
                                                                                "--config=",9),
                                                               iVar2 == 0)) {
                                                              local_2c = 2;
                                                              if (_i[(uint)param][1] == '-') {
                                                                local_2c = 9;
                                                              }
                                                              iVar2 = strncmp(pcStack_28 + local_2c,
                                                                              "full",4);
                                                              if (iVar2 == 0) {
                                                                *(uint *)params_local =
                                                                     *(uint *)params_local |
                                                                     0x379ecb;
                                                              }
                                                              else {
                                                                iVar2 = strncmp(pcStack_28 +
                                                                                local_2c,"default",7
                                                                               );
                                                                if (iVar2 == 0) {
                                                                  *(uint *)params_local =
                                                                       *(uint *)params_local |
                                                                       0x79acb;
                                                                }
                                                                else {
                                                                  iVar2 = strncmp(pcStack_28 +
                                                                                  local_2c,"fast",4)
                                                                  ;
                                                                  if (iVar2 == 0) {
                                                                    *(uint *)params_local =
                                                                         *(uint *)params_local |
                                                                         0x4802b;
                                                                  }
                                                                }
                                                              }
                                                            }
                                                            else {
                                                              iVar2 = strcmp(pcStack_28,"-l");
                                                              if ((iVar2 == 0) ||
                                                                 (iVar2 = strcmp(pcStack_28,
                                                                                 "--show-log"),
                                                                 iVar2 == 0)) {
                                                                *(undefined1 *)
                                                                 ((long)params_local + 4) = 1;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(pcStack_28,"-v");
                                                                if ((iVar2 == 0) ||
                                                                   (iVar2 = strcmp(pcStack_28,
                                                                                   "--verbose"),
                                                                   iVar2 == 0)) {
                                                                  *(undefined1 *)(params_local + 5)
                                                                       = 1;
                                                                }
                                                                else {
                                                                  iVar2 = strncmp(pcStack_28,
                                                                                  "--log-out=",10);
                                                                  if ((iVar2 == 0) ||
                                                                     (iVar2 = strncmp(pcStack_28,
                                                                                      "-lo",3),
                                                                     iVar2 == 0)) {
                                                                    pcVar1 = _i[(uint)param];
                                                                    lVar3 = 3;
                                                                    if (pcVar1[1] == '-') {
                                                                      lVar3 = 10;
                                                                    }
                                                                    std::allocator<char>::allocator
                                                                              ();
                                                                    std::__cxx11::string::
                                                                    string<std::allocator<char>>
                                                                              (local_50,pcVar1 + 
                                                  lVar3,&local_51);
                                                  std::__cxx11::string::operator=
                                                            ((string *)(params_local + 1),local_50);
                                                  std::__cxx11::string::~string(local_50);
                                                  std::allocator<char>::~allocator(&local_51);
                                                  lVar3 = std::__cxx11::string::length();
                                                  if (lVar3 == 0) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)(params_local + 1),
                                                               "assimp-log.txt");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  lVar3 = std::__cxx11::string::length();
  if (((lVar3 != 0) || (((ulong)*params_local & 0x100000000) != 0)) ||
     (((ulong)params_local[5] & 1) != 0)) {
    *(undefined1 *)((long)params_local + 0x29) = 1;
  }
  return 0;
}

Assistant:

int ProcessStandardArguments(
	ImportData& fill, 
	const char* const * params,
	unsigned int num)
{
	// -ptv    --pretransform-vertices
	// -gsn    --gen-smooth-normals
	// -gn     --gen-normals
	// -cts    --calc-tangent-space
	// -jiv    --join-identical-vertices
	// -rrm    --remove-redundant-materials
	// -fd     --find-degenerates
	// -slm    --split-large-meshes
	// -lbw    --limit-bone-weights
	// -vds    --validate-data-structure
	// -icl    --improve-cache-locality
	// -sbpt   --sort-by-ptype
	// -lh     --convert-to-lh
	// -fuv    --flip-uv
	// -fwo    --flip-winding-order
	// -tuv    --transform-uv-coords
	// -guv    --gen-uvcoords
	// -fid    --find-invalid-data
	// -fixn   --fix normals
	// -tri    --triangulate
	// -fi     --find-instances
	// -og     --optimize-graph
	// -om     --optimize-meshes
	// -db     --debone
	// -sbc    --split-by-bone-count
	// -gs	   --global-scale
	//
	// -c<file> --config-file=<file>

	for (unsigned int i = 0; i < num;++i) 
	{
        const char *param = params[ i ];
        printf( "param = %s\n", param );
		if (! strcmp( param, "-ptv") || ! strcmp( param, "--pretransform-vertices")) {
			fill.ppFlags |= aiProcess_PreTransformVertices;
		}
		else if (! strcmp( param, "-gsn") || ! strcmp( param, "--gen-smooth-normals")) {
			fill.ppFlags |= aiProcess_GenSmoothNormals;
		}
    else if (! strcmp( param, "-dn") || ! strcmp( param, "--drop-normals")) {
			fill.ppFlags |= aiProcess_DropNormals;
		}
		else if (! strcmp( param, "-gn") || ! strcmp( param, "--gen-normals")) {
			fill.ppFlags |= aiProcess_GenNormals;
		}
		else if (! strcmp( param, "-jiv") || ! strcmp( param, "--join-identical-vertices")) {
			fill.ppFlags |= aiProcess_JoinIdenticalVertices;
		}
		else if (! strcmp( param, "-rrm") || ! strcmp( param, "--remove-redundant-materials")) {
			fill.ppFlags |= aiProcess_RemoveRedundantMaterials;
		}
		else if (! strcmp( param, "-fd") || ! strcmp( param, "--find-degenerates")) {
			fill.ppFlags |= aiProcess_FindDegenerates;
		}
		else if (! strcmp( param, "-slm") || ! strcmp( param, "--split-large-meshes")) {
			fill.ppFlags |= aiProcess_SplitLargeMeshes;
		}
		else if (! strcmp( param, "-lbw") || ! strcmp( param, "--limit-bone-weights")) {
			fill.ppFlags |= aiProcess_LimitBoneWeights;
		}
		else if (! strcmp( param, "-vds") || ! strcmp( param, "--validate-data-structure")) {
			fill.ppFlags |= aiProcess_ValidateDataStructure;
		}
		else if (! strcmp( param, "-icl") || ! strcmp( param, "--improve-cache-locality")) {
			fill.ppFlags |= aiProcess_ImproveCacheLocality;
		}
		else if (! strcmp( param, "-sbpt") || ! strcmp( param, "--sort-by-ptype")) {
			fill.ppFlags |= aiProcess_SortByPType;
		}
		else if (! strcmp( param, "-lh") || ! strcmp( param, "--left-handed")) {
			fill.ppFlags |= aiProcess_ConvertToLeftHanded;
		}
		else if (! strcmp( param, "-fuv") || ! strcmp( param, "--flip-uv")) {
			fill.ppFlags |= aiProcess_FlipUVs;
		}
		else if (! strcmp( param, "-fwo") || ! strcmp( param, "--flip-winding-order")) {
			fill.ppFlags |= aiProcess_FlipWindingOrder;
		}
		else if (! strcmp( param, "-tuv") || ! strcmp( param, "--transform-uv-coords")) {
			fill.ppFlags |= aiProcess_TransformUVCoords;
		}
		else if (! strcmp( param, "-guv") || ! strcmp( param, "--gen-uvcoords")) {
			fill.ppFlags |= aiProcess_GenUVCoords;
		}
		else if (! strcmp( param, "-fid") || ! strcmp( param, "--find-invalid-data")) {
			fill.ppFlags |= aiProcess_FindInvalidData;
		}
		else if (! strcmp( param, "-fixn") || ! strcmp( param, "--fix-normals")) {
			fill.ppFlags |= aiProcess_FixInfacingNormals;
		}
		else if (! strcmp( param, "-tri") || ! strcmp( param, "--triangulate")) {
			fill.ppFlags |= aiProcess_Triangulate;
		}
		else if (! strcmp( param, "-cts") || ! strcmp( param, "--calc-tangent-space")) {
			fill.ppFlags |= aiProcess_CalcTangentSpace;
		}
		else if (! strcmp( param, "-fi") || ! strcmp( param, "--find-instances")) {
			fill.ppFlags |= aiProcess_FindInstances;
		}
		else if (! strcmp( param, "-og") || ! strcmp( param, "--optimize-graph")) {
			fill.ppFlags |= aiProcess_OptimizeGraph;
		}
		else if (! strcmp( param, "-om") || ! strcmp( param, "--optimize-meshes")) {
			fill.ppFlags |= aiProcess_OptimizeMeshes;
		}
		else if (! strcmp( param, "-db") || ! strcmp( param, "--debone")) {
			fill.ppFlags |= aiProcess_Debone;
		}
		else if (! strcmp( param, "-sbc") || ! strcmp( param, "--split-by-bone-count")) {
			fill.ppFlags |= aiProcess_SplitByBoneCount;
		}
		else if (!strcmp(param, "-embtex") || ! strcmp(param, "--embed-textures")) {
			fill.ppFlags |= aiProcess_EmbedTextures;
		}
		else if (!strcmp(param, "-gs") || ! strcmp(param, "--global-scale")) {
			fill.ppFlags |= aiProcess_GlobalScale;
		}
		else if (! strncmp( param, "-c",2) || ! strncmp( param, "--config=",9)) {
			const unsigned int ofs = (params[i][1] == '-' ? 9 : 2);

			// use default configurations
            if (!strncmp( param + ofs, "full", 4 )) {
                fill.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
            } else if (!strncmp( param + ofs, "default", 7 )) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Quality;
			} else if (! strncmp( param +ofs,"fast",4)) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Fast;
			}
		} else if (! strcmp( param, "-l") || ! strcmp( param, "--show-log")) {
			fill.showLog = true;
		}
		else if (! strcmp( param, "-v") || ! strcmp( param, "--verbose")) {
			fill.verbose = true;
		}
		else if (! strncmp( param, "--log-out=",10) || ! strncmp( param, "-lo",3)) {
			fill.logFile = std::string(params[i]+(params[i][1] == '-' ? 10 : 3));
			if (!fill.logFile.length()) {
				fill.logFile = "assimp-log.txt";
			}
		}
	}

	if (fill.logFile.length() || fill.showLog || fill.verbose) {
		fill.log = true;
	}

	return 0;
}